

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O1

int check_vector(N_Vector x,N_Vector y,realtype tol)

{
  uint uVar1;
  realtype *prVar2;
  realtype *prVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  prVar2 = N_VGetArrayPointer(x);
  prVar3 = N_VGetArrayPointer(y);
  lVar4 = N_VGetLength_Serial(x);
  lVar5 = N_VGetLength_Serial(y);
  if (lVar4 == lVar5) {
    if (lVar4 < 1) {
      uVar1 = 0;
    }
    else {
      lVar5 = 0;
      iVar6 = 0;
      do {
        if (NAN(prVar2[lVar5])) {
          uVar1 = 1;
        }
        else {
          uVar1 = (uint)(tol < ABS((prVar2[lVar5] - prVar3[lVar5]) / prVar3[lVar5]));
        }
        iVar6 = iVar6 + uVar1;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      uVar1 = (uint)(iVar6 != 0);
    }
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, realtype tol)
{
  int failure = 0;
  realtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata) {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return(1);
  }

  /* check vector data */
  for(i=0; i < xldata; i++){
    failure += FNEQ(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}